

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O1

int Rml::Math::HexToDecimal(char hex_digit)

{
  int iVar1;
  undefined3 in_register_00000039;
  int iVar2;
  
  iVar2 = CONCAT31(in_register_00000039,hex_digit);
  if ((byte)(hex_digit - 0x30U) < 10) {
    return iVar2 + -0x30;
  }
  if ((byte)(hex_digit + 0x9fU) < 6) {
    return iVar2 + -0x57;
  }
  iVar1 = -1;
  if ((byte)(hex_digit + 0xbfU) < 6) {
    iVar1 = iVar2 + -0x37;
  }
  return iVar1;
}

Assistant:

RMLUICORE_API int HexToDecimal(char hex_digit)
	{
		if (hex_digit >= '0' && hex_digit <= '9')
			return hex_digit - '0';
		else if (hex_digit >= 'a' && hex_digit <= 'f')
			return 10 + (hex_digit - 'a');
		else if (hex_digit >= 'A' && hex_digit <= 'F')
			return 10 + (hex_digit - 'A');

		return -1;
	}